

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O0

int max_background_threads_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  size_t *in_RCX;
  undefined8 in_RDI;
  ulong *in_R8;
  ulong *in_R9;
  long in_stack_00000008;
  size_t newval;
  size_t copylen_1;
  size_t copylen;
  size_t oldval;
  int ret;
  _Bool result;
  tsdn_t *in_stack_fffffffffffffea8;
  atomic_b_t *in_stack_fffffffffffffeb8;
  tsdn_t *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  size_t local_108;
  size_t local_100;
  size_t local_e0;
  int local_d4;
  ulong *local_d0;
  ulong *local_c8;
  size_t *local_c0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 local_78;
  byte bStack_61;
  undefined8 uStack_60;
  undefined4 uStack_58;
  undefined1 uStack_51;
  atomic_b_t *paStack_50;
  undefined4 uStack_44;
  undefined4 uStack_40;
  byte bStack_39;
  undefined8 uStack_38;
  undefined4 uStack_30;
  undefined1 uStack_29;
  atomic_b_t *paStack_28;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined1 uStack_15;
  undefined4 local_14;
  atomic_b_t *local_10;
  undefined4 local_8;
  undefined4 uStack_4;
  
  local_d0 = in_R9;
  local_c8 = in_R8;
  local_c0 = in_RCX;
  local_a8 = in_RDI;
  background_thread_ctl_init((tsdn_t *)0x1486ec);
  local_78 = local_a8;
  malloc_mutex_lock((tsdn_t *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                    (malloc_mutex_t *)in_stack_fffffffffffffec0);
  local_80 = local_a8;
  malloc_mutex_lock((tsdn_t *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                    (malloc_mutex_t *)in_stack_fffffffffffffec0);
  sVar2 = max_background_threads;
  if (local_d0 == (ulong *)0x0) {
    local_e0 = max_background_threads;
    uVar1 = max_background_threads;
    if ((local_c0 != (size_t *)0x0) && (local_c8 != (ulong *)0x0)) {
      if (*local_c8 != 8) {
        if (*local_c8 < 8) {
          local_100 = *local_c8;
        }
        else {
          local_100 = 8;
        }
        memcpy(local_c0,&local_e0,local_100);
        local_d4 = 0x16;
        goto LAB_00148cbe;
      }
      *local_c0 = max_background_threads;
      uVar1 = max_background_threads;
    }
  }
  else {
    if (in_stack_00000008 != 8) {
      local_d4 = 0x16;
      goto LAB_00148cbe;
    }
    local_e0 = max_background_threads;
    if ((local_c0 != (size_t *)0x0) && (local_c8 != (ulong *)0x0)) {
      if (*local_c8 != 8) {
        if (*local_c8 < 8) {
          local_108 = *local_c8;
        }
        else {
          local_108 = 8;
        }
        memcpy(local_c0,&local_e0,local_108);
        local_d4 = 0x16;
        goto LAB_00148cbe;
      }
      *local_c0 = max_background_threads;
    }
    uVar1 = *local_d0;
    if (uVar1 == sVar2) {
      local_d4 = 0;
      goto LAB_00148cbe;
    }
    if (opt_max_background_threads < uVar1) {
      local_d4 = 0x16;
      goto LAB_00148cbe;
    }
    local_10 = &background_thread_enabled_state;
    local_14 = 0;
    local_8 = 0;
    uStack_4 = 0;
    uStack_15 = background_thread_enabled_state.repr;
    if ((background_thread_enabled_state.repr & 1U) != 0) {
      uStack_88 = local_a8;
      uStack_38 = local_a8;
      bStack_39 = 0;
      malloc_mutex_assert_owner(in_stack_fffffffffffffea8,(malloc_mutex_t *)&UNK_00148a2e);
      paStack_28 = &background_thread_enabled_state;
      uStack_29 = bStack_39 & 1;
      uStack_30 = 0;
      uStack_20 = 0;
      uStack_1c = 0;
      background_thread_enabled_state.repr = (_Bool)uStack_29;
      uVar3 = func_0x0010ee40(local_a8);
      if ((uVar3 & 1) != 0) {
        local_d4 = 0xe;
        goto LAB_00148cbe;
      }
      uStack_90 = local_a8;
      uStack_60 = local_a8;
      bStack_61 = 1;
      max_background_threads = uVar1;
      malloc_mutex_assert_owner(in_stack_fffffffffffffea8,(malloc_mutex_t *)&UNK_00148b8e);
      paStack_50 = &background_thread_enabled_state;
      uStack_51 = bStack_61 & 1;
      uStack_58 = 0;
      in_stack_fffffffffffffeb8 = &background_thread_enabled_state;
      uStack_44 = 0;
      in_stack_fffffffffffffec0 = (tsdn_t *)0x0;
      uStack_40 = 0;
      background_thread_enabled_state.repr = (_Bool)uStack_51;
      uVar3 = func_0x0010efd0(local_a8);
      uVar1 = max_background_threads;
      if ((uVar3 & 1) != 0) {
        local_d4 = 0xe;
        goto LAB_00148cbe;
      }
    }
  }
  max_background_threads = uVar1;
  local_d4 = 0;
LAB_00148cbe:
  local_98 = local_a8;
  malloc_mutex_unlock(in_stack_fffffffffffffec0,(malloc_mutex_t *)in_stack_fffffffffffffeb8);
  local_a0 = local_a8;
  malloc_mutex_unlock(in_stack_fffffffffffffec0,(malloc_mutex_t *)in_stack_fffffffffffffeb8);
  return local_d4;
}

Assistant:

static int
max_background_threads_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp, void *newp,
    size_t newlen) {
	int ret;
	size_t oldval;

	if (!have_background_thread) {
		return ENOENT;
	}
	background_thread_ctl_init(tsd_tsdn(tsd));

	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);
	malloc_mutex_lock(tsd_tsdn(tsd), &background_thread_lock);
	if (newp == NULL) {
		oldval = max_background_threads;
		READ(oldval, size_t);
	} else {
		if (newlen != sizeof(size_t)) {
			ret = EINVAL;
			goto label_return;
		}
		oldval = max_background_threads;
		READ(oldval, size_t);

		size_t newval = *(size_t *)newp;
		if (newval == oldval) {
			ret = 0;
			goto label_return;
		}
		if (newval > opt_max_background_threads) {
			ret = EINVAL;
			goto label_return;
		}

		if (background_thread_enabled()) {
			background_thread_enabled_set(tsd_tsdn(tsd), false);
			if (background_threads_disable(tsd)) {
				ret = EFAULT;
				goto label_return;
			}
			max_background_threads = newval;
			background_thread_enabled_set(tsd_tsdn(tsd), true);
			if (background_threads_enable(tsd)) {
				ret = EFAULT;
				goto label_return;
			}
		} else {
			max_background_threads = newval;
		}
	}
	ret = 0;
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &background_thread_lock);
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);

	return ret;
}